

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Slice_x86::forward
          (Slice_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  unsigned_long *puVar4;
  int *piVar5;
  long in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  bool bVar6;
  float *outptr_5;
  Mat *top_blob_10;
  size_t i_12;
  int j_4;
  float *ptr_5;
  int p_2;
  Mat *top_blob_9;
  int slice_5;
  size_t i_11;
  int q_6;
  int channels_2;
  int h_4;
  int w_5;
  float *outptr_4;
  int size_3;
  Mat *top_blob_8;
  size_t i_10;
  float *ptr_4;
  int p_1;
  Mat *top_blob_7;
  int slice_4;
  size_t i_9;
  int q_5;
  int channels_1;
  int h_3;
  int w_4;
  float *outptr_3;
  float *ptr_3;
  int size_2;
  int j_3;
  float *outptr0_1;
  float *r3_1;
  float *r2_1;
  float *r1_1;
  float *r0_1;
  int q_4;
  int size_1;
  Mat *top_blob_6;
  size_t i_8;
  int p;
  Mat bottom_blob_unpacked_1;
  size_t i_7;
  int out_elempack_3;
  size_t out_elemsize_3;
  Mat *top_blob_5;
  size_t out_elemsize_4;
  int out_elempack_4;
  int slice_3;
  size_t i_6;
  int q_3;
  int channels;
  int h_2;
  int w_3;
  float *outptr_2;
  Mat *top_blob_4;
  size_t i_5;
  float *ptr_2;
  int j_2;
  Mat *top_blob_3;
  int slice_2;
  size_t i_4;
  int q_2;
  int h_1;
  int w_2;
  float *outptr_1;
  int size;
  int j_1;
  float *outptr0;
  float *r3;
  float *r2;
  float *r1;
  float *r0;
  int j;
  Mat *top_blob_2;
  size_t i_3;
  float *ptr_1;
  Mat bottom_blob_unpacked;
  size_t i_2;
  int out_elempack_1;
  size_t out_elemsize_1;
  Mat *top_blob_1;
  size_t out_elemsize_2;
  int out_elempack_2;
  int slice_1;
  size_t i_1;
  int q_1;
  int h;
  int w_1;
  float *outptr;
  float *ptr;
  Mat *top_blob;
  size_t out_elemsize;
  int out_elempack;
  int slice;
  size_t i;
  int q;
  int w;
  int positive_axis;
  int *slices_ptr;
  int elempack;
  size_t elemsize;
  int dims;
  Mat *bottom_blob;
  Mat *m_9;
  Mat *m_7;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Mat *m_8;
  Mat *m_6;
  Allocator *in_stack_ffffffffffffed60;
  size_t in_stack_ffffffffffffed68;
  size_t in_stack_ffffffffffffed70;
  Option *in_stack_ffffffffffffed78;
  ulong uVar7;
  Mat *in_stack_ffffffffffffed80;
  Mat *in_stack_ffffffffffffed88;
  Mat *in_stack_ffffffffffffed90;
  Allocator *in_stack_ffffffffffffede0;
  int local_fb4;
  undefined8 local_fa8;
  undefined8 local_fa0;
  undefined8 local_f98;
  undefined4 local_f90;
  Allocator *local_f88;
  undefined4 local_f80;
  undefined4 local_f7c;
  undefined4 local_f78;
  undefined4 local_f74;
  undefined4 local_f70;
  undefined8 local_f68;
  void *local_f60;
  reference local_f58;
  ulong local_f50;
  int local_f44;
  undefined8 local_f40;
  undefined8 local_f38;
  undefined8 local_f30;
  undefined4 local_f28;
  Allocator *local_f20;
  undefined4 local_f18;
  undefined4 local_f14;
  undefined4 local_f10;
  undefined4 local_f0c;
  undefined4 local_f08;
  undefined8 local_f00;
  void *local_ef8;
  int local_eec;
  reference local_ee8;
  int local_edc;
  ulong local_ed8;
  int local_ed0;
  int local_ecc;
  int local_ec8;
  int local_ec4;
  Allocator local_ec0;
  undefined8 local_eb8;
  undefined8 local_eb0;
  undefined4 local_ea8;
  Allocator *local_ea0;
  undefined4 local_e98;
  undefined4 local_e94;
  undefined4 local_e90;
  undefined4 local_e8c;
  undefined4 local_e88;
  undefined8 local_e80;
  void *local_e78;
  int local_e6c;
  reference local_e68;
  ulong local_e60;
  undefined8 local_e58;
  undefined8 local_e50;
  undefined8 local_e48;
  undefined4 local_e40;
  Allocator *local_e38;
  undefined4 local_e30;
  undefined4 local_e2c;
  undefined4 local_e28;
  undefined4 local_e24;
  undefined4 local_e20;
  undefined8 local_e18;
  void *local_e10;
  int local_e04;
  reference local_e00;
  int local_df4;
  ulong local_df0;
  int local_de8;
  int local_de4;
  int local_de0;
  int local_ddc;
  void *local_dd8;
  undefined8 local_dd0;
  undefined8 local_dc8;
  undefined8 local_dc0;
  undefined4 local_db8;
  Allocator *local_db0;
  undefined4 local_da8;
  undefined4 local_da4;
  undefined4 local_da0;
  undefined4 local_d9c;
  undefined4 local_d98;
  undefined8 local_d90;
  void *local_d88;
  int local_d80;
  int local_d7c;
  undefined8 local_d78;
  undefined8 local_d70;
  undefined8 local_d68;
  undefined4 local_d60;
  Allocator *local_d58;
  undefined4 local_d50;
  undefined4 local_d4c;
  undefined4 local_d48;
  undefined4 local_d44;
  undefined4 local_d40;
  undefined8 local_d38;
  undefined4 *local_d30;
  undefined8 local_d28;
  undefined8 local_d20;
  undefined8 local_d18;
  undefined4 local_d10;
  Allocator *local_d08;
  undefined4 local_d00;
  undefined4 local_cfc;
  undefined4 local_cf8;
  undefined4 local_cf4;
  undefined4 local_cf0;
  undefined8 local_ce8;
  undefined4 *local_ce0;
  undefined8 local_cd8;
  undefined8 local_cd0;
  undefined8 local_cc8;
  undefined4 local_cc0;
  Allocator *local_cb8;
  undefined4 local_cb0;
  undefined4 local_cac;
  undefined4 local_ca8;
  undefined4 local_ca4;
  undefined4 local_ca0;
  undefined8 local_c98;
  undefined4 *local_c90;
  undefined8 local_c88;
  undefined8 local_c80;
  undefined8 local_c78;
  undefined4 local_c70;
  Allocator *local_c68;
  undefined4 local_c60;
  undefined4 local_c5c;
  undefined4 local_c58;
  undefined4 local_c54;
  undefined4 local_c50;
  undefined8 local_c48;
  undefined4 *local_c40;
  undefined8 local_c38;
  undefined8 local_c30;
  undefined8 local_c28;
  undefined4 local_c20;
  Allocator *local_c18;
  undefined4 local_c10;
  undefined4 local_c0c;
  undefined4 local_c08;
  undefined4 local_c04;
  undefined4 local_c00;
  undefined8 local_bf8;
  undefined4 *local_bf0;
  int local_be8;
  int local_be4;
  reference local_be0;
  ulong local_bd8;
  int local_bcc;
  void *local_bc8;
  int *local_bc0;
  size_t local_bb8;
  int local_bb0;
  Allocator *local_ba8;
  int local_ba0;
  int local_b9c;
  int local_b98;
  int local_b94;
  int local_b90;
  size_t local_b88;
  ulong local_b80;
  int local_b74;
  size_t local_b70;
  reference local_b68;
  long local_b60;
  int local_b58;
  int local_b54;
  ulong local_b50;
  int local_b48;
  int local_b44;
  int local_b40;
  int local_b3c;
  void *local_b38;
  reference local_b30;
  ulong local_b28;
  void *local_b20;
  int local_b14;
  reference local_b10;
  int local_b04;
  ulong local_b00;
  int local_af4;
  int local_af0;
  int local_aec;
  void *local_ae8;
  int local_ae0;
  int local_adc;
  undefined4 *local_ad8;
  undefined4 *local_ad0;
  undefined4 *local_ac8;
  undefined4 *local_ac0;
  undefined4 *local_ab8;
  int local_aac;
  reference local_aa8;
  ulong local_aa0;
  undefined4 *local_a98;
  undefined4 *local_a80;
  int *local_a78;
  size_t local_a70;
  int local_a68;
  Allocator *local_a60;
  int local_a58;
  int local_a54;
  int local_a50;
  int local_a4c;
  int local_a48;
  size_t local_a40;
  ulong local_a38;
  int local_a2c;
  size_t local_a28;
  reference local_a20;
  long local_a18;
  int local_a10;
  int local_a0c;
  ulong local_a08;
  int local_9fc;
  int local_9f8;
  int local_9f4;
  void *local_9f0;
  void *local_9e8;
  reference local_9e0;
  long local_9d8;
  int local_9d0;
  int local_9cc;
  ulong local_9c8;
  int local_9bc;
  int local_9b8;
  int local_9b4;
  long local_9b0;
  int local_9a4;
  size_t local_9a0;
  int local_994;
  const_reference local_990;
  long local_988;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_980;
  long *local_960;
  reference local_958;
  reference local_950;
  reference local_948;
  reference local_940;
  reference local_938;
  reference local_930;
  undefined8 *local_928;
  undefined8 *local_920;
  const_reference local_918;
  Allocator *local_910;
  reference local_908;
  undefined8 *local_900;
  reference local_8f8;
  reference local_8f0;
  const_reference local_8e8;
  undefined4 **local_8e0;
  const_reference local_8d8;
  void **local_8d0;
  undefined8 *local_8c8;
  undefined8 *local_8c0;
  undefined8 *local_8b8;
  undefined8 *local_8b0;
  undefined8 *local_8a8;
  undefined4 **local_8a0;
  int local_894;
  undefined8 *local_890;
  int local_884;
  reference local_880;
  int local_874;
  reference local_870;
  undefined4 **local_868;
  undefined8 *local_858;
  undefined8 *local_848;
  undefined8 *local_838;
  undefined8 *local_828;
  undefined8 *local_818;
  undefined8 *local_808;
  void **local_7f8;
  undefined8 *local_7e8;
  Allocator *local_7d8;
  undefined8 *local_7c8;
  undefined8 *local_7b8;
  int local_7a4;
  const_reference local_7a0;
  undefined1 local_795;
  int local_794;
  reference local_790;
  undefined8 *local_788;
  undefined1 local_775;
  int local_774;
  reference local_770;
  Allocator *local_768;
  undefined1 local_755;
  int local_754;
  void **local_750;
  undefined8 *local_748;
  undefined1 local_735;
  int local_734;
  reference local_730;
  undefined8 *local_728;
  undefined1 local_715;
  int local_714;
  void **local_710;
  undefined8 *local_708;
  undefined1 local_6f5;
  int local_6f4;
  void **local_6f0;
  undefined8 *local_6e8;
  undefined1 local_6d5;
  int local_6d4;
  void **local_6d0;
  undefined8 *local_6c8;
  undefined1 local_6b5;
  int local_6b4;
  void **local_6b0;
  undefined8 *local_6a8;
  reference local_698;
  reference local_690;
  reference local_688;
  reference local_680;
  reference local_678;
  reference local_670;
  reference local_668;
  undefined1 local_65d;
  int local_65c;
  const_reference local_658;
  undefined8 *local_650;
  undefined1 local_63d;
  int local_63c;
  const_reference local_638;
  undefined8 *local_630;
  int local_620;
  undefined4 local_61c;
  void **local_618;
  int local_610;
  undefined4 local_60c;
  undefined4 **local_608;
  undefined8 *local_548;
  undefined8 *local_528;
  Allocator *local_508;
  undefined8 *local_4e8;
  int local_4d0;
  undefined4 local_4cc;
  void **local_4c8;
  undefined8 *local_4a8;
  undefined8 *local_488;
  undefined8 *local_468;
  undefined8 *local_448;
  undefined8 *local_428;
  undefined8 *local_408;
  int local_3f0;
  undefined4 local_3ec;
  undefined4 **local_3e8;
  undefined4 *local_3e0;
  void *local_370;
  Allocator *local_2d0;
  int local_2c4;
  size_t local_2c0;
  void *local_2b8;
  int local_2ac;
  int local_2a8;
  int local_2a4;
  undefined8 *local_2a0;
  Allocator *local_298;
  int local_28c;
  size_t local_288;
  void *local_280;
  int local_274;
  int local_270;
  int local_26c;
  undefined8 *local_268;
  Allocator *local_260;
  int local_254;
  size_t local_250;
  undefined4 *local_248;
  int local_23c;
  int local_238;
  int local_234;
  undefined8 *local_230;
  Allocator *local_228;
  int local_21c;
  size_t local_218;
  undefined4 *local_210;
  int local_204;
  int local_200;
  int local_1fc;
  undefined8 *local_1f8;
  Allocator *local_1f0;
  int local_1e4;
  size_t local_1e0;
  undefined4 *local_1d8;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  undefined8 *local_1c0;
  Allocator *local_1b8;
  int local_1ac;
  size_t local_1a8;
  undefined4 *local_1a0;
  int local_194;
  int local_190;
  int local_18c;
  undefined8 *local_188;
  Allocator *local_180;
  int local_174;
  size_t local_170;
  undefined4 *local_168;
  int local_15c;
  int local_158;
  int local_154;
  undefined8 *local_150;
  Allocator *local_148;
  int local_13c;
  size_t local_138;
  void *local_130;
  int local_124;
  int local_120;
  int local_11c;
  undefined8 *local_118;
  Allocator *local_110;
  int local_104;
  size_t local_100;
  void *local_f8;
  int local_ec;
  int local_e8;
  int local_e4;
  Allocator *local_e0;
  Allocator *local_d8;
  int local_cc;
  size_t local_c8;
  void *local_c0;
  int local_b4;
  int local_b0;
  int local_ac;
  undefined8 *local_a8;
  undefined4 local_9c;
  long local_98;
  undefined4 local_8c;
  long local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_988 = in_RCX;
  local_980 = in_RDX;
  local_990 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_994 = local_990->dims;
  local_9a0 = local_990->elemsize;
  local_9a4 = local_990->elempack;
  local_960 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
  local_9b0 = *local_960;
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x118) < 0) {
    local_fb4 = local_994 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x118);
  }
  else {
    local_fb4 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x118);
  }
  local_9b4 = local_fb4;
  if (local_994 == 1) {
    local_9b8 = local_990->w * local_9a4;
    local_9bc = 0;
    for (local_9c8 = 0; uVar7 = local_9c8,
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_980), uVar7 < sVar2;
        local_9c8 = local_9c8 + 1) {
      local_9cc = *(int *)(local_9b0 + local_9c8 * 4);
      if (local_9cc == -0xe9) {
        iVar1 = local_9b8 - local_9bc;
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_980);
        local_9cc = (int)((ulong)(long)iVar1 / (sVar2 - local_9c8));
      }
      local_9d0 = 1;
      if (((*(byte *)(local_988 + 0x27) & 1) != 0) && (local_9d0 = 1, local_9cc % 4 == 0)) {
        local_9d0 = 4;
      }
      local_9d8 = (local_9a0 / (ulong)(long)local_9a4) * (long)local_9d0;
      local_9e0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_980,local_9c8);
      Mat::create(in_stack_ffffffffffffed80,(int)((ulong)in_stack_ffffffffffffed78 >> 0x20),
                  in_stack_ffffffffffffed70,(int)(in_stack_ffffffffffffed68 >> 0x20),
                  in_stack_ffffffffffffed60);
      local_930 = local_9e0;
      bVar6 = true;
      if (local_9e0->data != (void *)0x0) {
        local_698 = local_9e0;
        bVar6 = local_9e0->cstep * (long)local_9e0->c == 0;
      }
      if (bVar6) {
        return -100;
      }
      local_918 = local_990;
      local_9e8 = (void *)((long)local_990->data + (long)local_9bc * 4);
      local_8f0 = local_9e0;
      local_9f0 = local_9e0->data;
      memcpy(local_9f0,local_9e8,(long)local_9e0->w * local_9e0->elemsize);
      local_9bc = local_9cc + local_9bc;
    }
  }
  if ((local_994 == 2) && (local_9b4 == 0)) {
    local_9f4 = local_990->w;
    local_9f8 = local_990->h * local_9a4;
    local_9fc = 0;
    for (local_a08 = 0; uVar7 = local_a08,
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_980), uVar7 < sVar2;
        local_a08 = local_a08 + 1) {
      local_a0c = *(int *)(local_9b0 + local_a08 * 4);
      if (local_a0c == -0xe9) {
        iVar1 = local_9f8 - local_9fc;
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_980);
        local_a0c = (int)((ulong)(long)iVar1 / (sVar2 - local_a08));
      }
      local_a10 = 1;
      if (((*(byte *)(local_988 + 0x27) & 1) != 0) && (local_a10 = 1, local_a0c % 4 == 0)) {
        local_a10 = 4;
      }
      local_a18 = (local_9a0 / (ulong)(long)local_9a4) * (long)local_a10;
      local_a20 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_980,local_a08);
      Mat::create(in_stack_ffffffffffffed80,(int)((ulong)in_stack_ffffffffffffed78 >> 0x20),
                  (int)in_stack_ffffffffffffed78,in_stack_ffffffffffffed70,
                  (int)(in_stack_ffffffffffffed68 >> 0x20),in_stack_ffffffffffffed60);
      local_938 = local_a20;
      bVar6 = true;
      if (local_a20->data != (void *)0x0) {
        local_690 = local_a20;
        bVar6 = local_a20->cstep * (long)local_a20->c == 0;
      }
      if (bVar6) {
        return -100;
      }
      local_9fc = local_a0c + local_9fc;
    }
    pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_980,0);
    local_a28 = pvVar3->elemsize;
    pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_980,0);
    local_a2c = pvVar3->elempack;
    for (local_a38 = 0; uVar7 = local_a38,
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_980), uVar7 < sVar2;
        local_a38 = local_a38 + 1) {
      pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_980,local_a38);
      puVar4 = std::min<unsigned_long>(&local_a28,&pvVar3->elemsize);
      local_a28 = *puVar4;
      pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_980,local_a38);
      piVar5 = std::min<int>(&local_a2c,&pvVar3->elempack);
      local_a2c = *piVar5;
    }
    local_8e0 = &local_a80;
    local_8e8 = local_990;
    local_a80 = (undefined4 *)local_990->data;
    local_a78 = local_990->refcount;
    local_a70 = local_990->elemsize;
    local_a68 = local_990->elempack;
    local_a60 = local_990->allocator;
    local_a58 = local_990->dims;
    local_a54 = local_990->w;
    local_a50 = local_990->h;
    local_a4c = local_990->d;
    local_a48 = local_990->c;
    local_a40 = local_990->cstep;
    if (local_a78 != (int *)0x0) {
      local_60c = 1;
      LOCK();
      local_610 = *local_a78;
      *local_a78 = *local_a78 + 1;
      UNLOCK();
    }
    local_608 = local_8e0;
    if (local_a2c < local_9a4) {
      convert_packing(in_stack_ffffffffffffed90,in_stack_ffffffffffffed88,
                      (int)((ulong)in_stack_ffffffffffffed80 >> 0x20),in_stack_ffffffffffffed78);
    }
    local_8a0 = &local_a80;
    local_a98 = local_a80;
    for (local_aa0 = 0; uVar7 = local_aa0,
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_980), uVar7 < sVar2;
        local_aa0 = local_aa0 + 1) {
      local_aa8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_980,local_aa0);
      if ((local_a2c == 1) && (local_aa8->elempack == 4)) {
        for (local_aac = 0; local_aac < local_aa8->h; local_aac = local_aac + 1) {
          local_ab8 = local_a98;
          local_874 = local_aac;
          local_ad8 = (undefined4 *)
                      ((long)local_aa8->data +
                      (long)local_aa8->w * (long)local_aac * local_aa8->elemsize);
          local_ad0 = local_a98 + local_9f4 * 3;
          local_ac8 = local_a98 + (local_9f4 << 1);
          local_ac0 = local_a98 + local_9f4;
          for (local_adc = 0; local_adc < local_9f4; local_adc = local_adc + 1) {
            *local_ad8 = *local_ab8;
            local_ad8[1] = *local_ac0;
            local_ad8[2] = *local_ac8;
            local_ad8[3] = *local_ad0;
            local_ad8 = local_ad8 + 4;
            local_ad0 = local_ad0 + 1;
            local_ac8 = local_ac8 + 1;
            local_ac0 = local_ac0 + 1;
            local_ab8 = local_ab8 + 1;
          }
          local_a98 = local_a98 + (local_9f4 << 2);
          local_870 = local_aa8;
        }
      }
      if (local_a2c == local_aa8->elempack) {
        local_ae0 = local_9f4 * local_aa8->h;
        local_ae8 = local_aa8->data;
        local_8f8 = local_aa8;
        memcpy(local_ae8,local_a98,(long)local_ae0 * local_aa8->elemsize);
        local_a98 = local_a98 + local_ae0 * local_aa8->elempack;
      }
    }
    local_868 = &local_a80;
    local_3e8 = local_868;
    if (local_a78 != (int *)0x0) {
      local_3ec = 0xffffffff;
      LOCK();
      local_3f0 = *local_a78;
      *local_a78 = *local_a78 + -1;
      UNLOCK();
      if (local_3f0 == 1) {
        if (local_a60 == (Allocator *)0x0) {
          local_3e0 = local_a80;
          if (local_a80 != (undefined4 *)0x0) {
            free(local_a80);
          }
        }
        else {
          (*local_a60->_vptr_Allocator[3])(local_a60,local_a80);
        }
      }
    }
    local_a80 = (undefined4 *)0x0;
    local_a70 = 0;
    local_a68 = 0;
    local_a58 = 0;
    local_a54 = 0;
    local_a50 = 0;
    local_a4c = 0;
    local_a48 = 0;
    local_a40 = 0;
    local_a78 = (int *)0x0;
  }
  if ((local_994 == 2) && (local_9b4 == 1)) {
    local_aec = local_990->w;
    local_af0 = local_990->h;
    local_af4 = 0;
    for (local_b00 = 0; uVar7 = local_b00,
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_980), uVar7 < sVar2;
        local_b00 = local_b00 + 1) {
      local_b04 = *(int *)(local_9b0 + local_b00 * 4);
      if (local_b04 == -0xe9) {
        iVar1 = local_aec - local_af4;
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_980);
        local_b04 = (int)((ulong)(long)iVar1 / (sVar2 - local_b00));
      }
      local_b10 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_980,local_b00);
      Mat::create(in_stack_ffffffffffffed80,(int)((ulong)in_stack_ffffffffffffed78 >> 0x20),
                  (int)in_stack_ffffffffffffed78,in_stack_ffffffffffffed70,
                  (int)(in_stack_ffffffffffffed68 >> 0x20),in_stack_ffffffffffffed60);
      local_940 = local_b10;
      bVar6 = true;
      if (local_b10->data != (void *)0x0) {
        local_688 = local_b10;
        bVar6 = local_b10->cstep * (long)local_b10->c == 0;
      }
      if (bVar6) {
        return -100;
      }
      local_af4 = local_b04 + local_af4;
    }
    for (local_b14 = 0; local_b14 < local_af0; local_b14 = local_b14 + 1) {
      local_7a0 = local_990;
      local_7a4 = local_b14;
      local_b20 = (void *)((long)local_990->data +
                          (long)local_990->w * (long)local_b14 * local_990->elemsize);
      for (local_b28 = 0; uVar7 = local_b28,
          sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_980), uVar7 < sVar2
          ; local_b28 = local_b28 + 1) {
        local_b30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (local_980,local_b28);
        local_884 = local_b14;
        local_b38 = (void *)((long)local_b30->data +
                            (long)local_b30->w * (long)local_b14 * local_b30->elemsize);
        local_880 = local_b30;
        memcpy(local_b38,local_b20,(long)local_b30->w * local_9a0);
        local_b20 = (void *)((long)local_b20 + (long)(local_b30->w * local_9a4) * 4);
      }
    }
  }
  if ((local_994 == 3) && (local_9b4 == 0)) {
    local_b3c = local_990->w;
    local_b40 = local_990->h;
    local_b44 = local_990->c * local_9a4;
    local_b48 = 0;
    for (local_b50 = 0; uVar7 = local_b50,
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_980), uVar7 < sVar2;
        local_b50 = local_b50 + 1) {
      local_b54 = *(int *)(local_9b0 + local_b50 * 4);
      if (local_b54 == -0xe9) {
        iVar1 = local_b44 - local_b48;
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_980);
        local_b54 = (int)((ulong)(long)iVar1 / (sVar2 - local_b50));
      }
      local_b58 = 1;
      if (((*(byte *)(local_988 + 0x27) & 1) != 0) && (local_b58 = 1, local_b54 % 4 == 0)) {
        local_b58 = 4;
      }
      local_b60 = (local_9a0 / (ulong)(long)local_9a4) * (long)local_b58;
      local_b68 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_980,local_b50);
      Mat::create(in_stack_ffffffffffffed80,(int)((ulong)in_stack_ffffffffffffed78 >> 0x20),
                  (int)in_stack_ffffffffffffed78,(int)(in_stack_ffffffffffffed70 >> 0x20),
                  in_stack_ffffffffffffed68,(int)((ulong)in_stack_ffffffffffffed60 >> 0x20),
                  in_stack_ffffffffffffede0);
      local_948 = local_b68;
      bVar6 = true;
      if (local_b68->data != (void *)0x0) {
        local_680 = local_b68;
        bVar6 = local_b68->cstep * (long)local_b68->c == 0;
      }
      if (bVar6) {
        return -100;
      }
      local_b48 = local_b54 + local_b48;
    }
    pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_980,0);
    local_b70 = pvVar3->elemsize;
    pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_980,0);
    local_b74 = pvVar3->elempack;
    for (local_b80 = 0; uVar7 = local_b80,
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_980), uVar7 < sVar2;
        local_b80 = local_b80 + 1) {
      pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_980,local_b80);
      puVar4 = std::min<unsigned_long>(&local_b70,&pvVar3->elemsize);
      local_b70 = *puVar4;
      pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_980,local_b80);
      piVar5 = std::min<int>(&local_b74,&pvVar3->elempack);
      local_b74 = *piVar5;
    }
    local_8d0 = &local_bc8;
    local_8d8 = local_990;
    local_bc8 = local_990->data;
    local_bc0 = local_990->refcount;
    local_bb8 = local_990->elemsize;
    local_bb0 = local_990->elempack;
    local_ba8 = local_990->allocator;
    local_ba0 = local_990->dims;
    local_b9c = local_990->w;
    local_b98 = local_990->h;
    local_b94 = local_990->d;
    local_b90 = local_990->c;
    local_b88 = local_990->cstep;
    if (local_bc0 != (int *)0x0) {
      local_61c = 1;
      LOCK();
      local_620 = *local_bc0;
      *local_bc0 = *local_bc0 + 1;
      UNLOCK();
    }
    local_618 = local_8d0;
    if (local_b74 < local_9a4) {
      convert_packing(in_stack_ffffffffffffed90,in_stack_ffffffffffffed88,
                      (int)((ulong)in_stack_ffffffffffffed80 >> 0x20),in_stack_ffffffffffffed78);
    }
    local_bcc = 0;
    for (local_bd8 = 0; uVar7 = local_bd8,
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_980), uVar7 < sVar2;
        local_bd8 = local_bd8 + 1) {
      local_be0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_980,local_bd8);
      if ((local_b74 == 1) && (local_be0->elempack == 4)) {
        local_be4 = local_be0->w * local_be0->h;
        for (local_be8 = 0; local_be8 < local_be0->c; local_be8 = local_be8 + 1) {
          local_6a8 = &local_c38;
          local_6b0 = &local_bc8;
          local_248 = (undefined4 *)((long)local_bc8 + local_b88 * (long)local_bcc * local_bb8);
          local_230 = &local_c38;
          local_28 = (long)local_b9c * (long)local_b98 * local_bb8;
          local_8a8 = &local_c38;
          local_858 = &local_c38;
          local_6d4 = local_bcc + 1;
          local_6c8 = &local_c88;
          local_6d0 = &local_bc8;
          local_210 = (undefined4 *)((long)local_bc8 + local_b88 * (long)local_6d4 * local_bb8);
          local_1f8 = &local_c88;
          local_38 = (long)local_b9c * (long)local_b98 * local_bb8;
          local_8b0 = &local_c88;
          local_848 = &local_c88;
          local_6f4 = local_bcc + 2;
          local_6e8 = &local_cd8;
          local_6f0 = &local_bc8;
          local_1d8 = (undefined4 *)((long)local_bc8 + local_b88 * (long)local_6f4 * local_bb8);
          local_1c0 = &local_cd8;
          local_48 = (long)local_b9c * (long)local_b98 * local_bb8;
          local_8b8 = &local_cd8;
          local_838 = &local_cd8;
          local_714 = local_bcc + 3;
          local_708 = &local_d28;
          local_710 = &local_bc8;
          local_1a0 = (undefined4 *)((long)local_bc8 + local_b88 * (long)local_714 * local_bb8);
          local_188 = &local_d28;
          local_58 = (long)local_b9c * (long)local_b98 * local_bb8;
          local_8c0 = &local_d28;
          local_828 = &local_d28;
          local_c00 = 0;
          local_c04 = 0;
          local_c08 = 0;
          local_c0c = 0;
          local_c18 = local_ba8;
          local_c20 = 0;
          local_c28 = 0;
          local_c30 = 0;
          local_c38 = 0;
          local_c50 = 0;
          local_c54 = 0;
          local_c58 = 0;
          local_c5c = 0;
          local_c68 = local_ba8;
          local_c70 = 0;
          local_c78 = 0;
          local_c80 = 0;
          local_c88 = 0;
          local_ca0 = 0;
          local_ca4 = 0;
          local_ca8 = 0;
          local_cac = 0;
          local_cb8 = local_ba8;
          local_cc0 = 0;
          local_cc8 = 0;
          local_cd0 = 0;
          local_cd8 = 0;
          local_d08 = local_ba8;
          local_2c = 0x10;
          local_3c = 0x10;
          local_4c = 0x10;
          local_5c = 0x10;
          local_18c = local_b9c;
          local_190 = local_b98;
          local_194 = local_b94;
          local_1a8 = local_bb8;
          local_1ac = local_bb0;
          local_1b8 = local_ba8;
          local_1c4 = local_b9c;
          local_1c8 = local_b98;
          local_1cc = local_b94;
          local_1e0 = local_bb8;
          local_1e4 = local_bb0;
          local_1f0 = local_ba8;
          local_1fc = local_b9c;
          local_200 = local_b98;
          local_204 = local_b94;
          local_218 = local_bb8;
          local_21c = local_bb0;
          local_228 = local_ba8;
          local_234 = local_b9c;
          local_238 = local_b98;
          local_23c = local_b94;
          local_250 = local_bb8;
          local_254 = local_bb0;
          local_260 = local_ba8;
          local_6b4 = local_bcc;
          local_6b5 = 1;
          local_6d5 = 1;
          local_6f5 = 1;
          local_715 = 1;
          local_bf8 = 0;
          local_c10 = 0;
          local_c48 = 0;
          local_c60 = 0;
          local_c98 = 0;
          local_cb0 = 0;
          local_d28 = 0;
          local_d18 = 0;
          local_d10 = 0;
          local_cfc = 0;
          local_cf8 = 0;
          local_cf4 = 0;
          local_cf0 = 0;
          local_d20 = 0;
          local_728 = &local_d78;
          local_154 = local_be0->w;
          local_158 = local_be0->h;
          local_15c = local_be0->d;
          local_168 = (undefined4 *)
                      ((long)local_be0->data +
                      local_be0->cstep * (long)local_be8 * local_be0->elemsize);
          local_170 = local_be0->elemsize;
          local_174 = local_be0->elempack;
          local_180 = local_be0->allocator;
          local_150 = &local_d78;
          local_68 = (long)local_154 * (long)local_158 * local_170;
          local_6c = 0x10;
          local_734 = local_be8;
          local_735 = 1;
          local_ce8 = 0;
          local_d00 = 0;
          local_900 = &local_d78;
          local_818 = &local_d78;
          local_d78 = 0;
          local_d68 = 0;
          local_d60 = 0;
          local_d50 = 0;
          local_d4c = 0;
          local_d48 = 0;
          local_d44 = 0;
          local_d40 = 0;
          local_d38 = 0;
          local_d70 = 0;
          local_d30 = local_168;
          local_ce0 = local_1a0;
          local_c90 = local_1d8;
          local_c40 = local_210;
          local_bf0 = local_248;
          for (local_d7c = 0; local_d7c < local_be4; local_d7c = local_d7c + 1) {
            *local_d30 = *local_bf0;
            local_d30[1] = *local_c40;
            local_d30[2] = *local_c90;
            local_d30[3] = *local_ce0;
            local_d30 = local_d30 + 4;
            local_ce0 = local_ce0 + 1;
            local_c90 = local_c90 + 1;
            local_c40 = local_c40 + 1;
            local_bf0 = local_bf0 + 1;
          }
          local_bcc = local_bcc + 4;
          local_730 = local_be0;
          local_488 = local_818;
          local_468 = local_828;
          local_448 = local_838;
          local_428 = local_848;
          local_408 = local_858;
          local_d58 = local_180;
        }
      }
      if (local_b74 == local_be0->elempack) {
        local_d80 = (int)local_be0->cstep * local_be0->c;
        local_748 = &local_dd0;
        local_750 = &local_bc8;
        local_d88 = (void *)((long)local_bc8 + local_b88 * (long)local_bcc * local_bb8);
        local_118 = &local_dd0;
        local_78 = (long)local_b9c * (long)local_b98 * local_bb8;
        local_8c8 = &local_dd0;
        local_808 = &local_dd0;
        local_db0 = local_ba8;
        local_7c = 0x10;
        local_11c = local_b9c;
        local_120 = local_b98;
        local_124 = local_b94;
        local_138 = local_bb8;
        local_13c = local_bb0;
        local_148 = local_ba8;
        local_754 = local_bcc;
        local_755 = 1;
        local_dd0 = 0;
        local_dc0 = 0;
        local_db8 = 0;
        local_da8 = 0;
        local_da4 = 0;
        local_da0 = 0;
        local_d9c = 0;
        local_d98 = 0;
        local_d90 = 0;
        local_dc8 = 0;
        local_dd8 = local_be0->data;
        local_908 = local_be0;
        local_668 = local_be0;
        local_4a8 = local_808;
        local_130 = local_d88;
        memcpy(local_dd8,local_d88,(long)local_d80 * local_be0->elemsize);
        local_bcc = local_be0->c + local_bcc;
      }
    }
    local_7f8 = &local_bc8;
    local_4c8 = local_7f8;
    if (local_bc0 != (int *)0x0) {
      local_4cc = 0xffffffff;
      LOCK();
      local_4d0 = *local_bc0;
      *local_bc0 = *local_bc0 + -1;
      UNLOCK();
      if (local_4d0 == 1) {
        if (local_ba8 == (Allocator *)0x0) {
          local_370 = local_bc8;
          if (local_bc8 != (void *)0x0) {
            free(local_bc8);
          }
        }
        else {
          (*local_ba8->_vptr_Allocator[3])(local_ba8,local_bc8);
        }
      }
    }
    local_bc8 = (void *)0x0;
    local_bb8 = 0;
    local_bb0 = 0;
    local_ba0 = 0;
    local_b9c = 0;
    local_b98 = 0;
    local_b94 = 0;
    local_b90 = 0;
    local_b88 = 0;
    local_bc0 = (int *)0x0;
  }
  if ((local_994 == 3) && (local_9b4 == 1)) {
    local_ddc = local_990->w;
    local_de0 = local_990->h;
    local_de4 = local_990->c;
    local_de8 = 0;
    for (local_df0 = 0; uVar7 = local_df0,
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_980), uVar7 < sVar2;
        local_df0 = local_df0 + 1) {
      local_df4 = *(int *)(local_9b0 + local_df0 * 4);
      if (local_df4 == -0xe9) {
        iVar1 = local_de0 - local_de8;
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_980);
        local_df4 = (int)((ulong)(long)iVar1 / (sVar2 - local_df0));
      }
      local_e00 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_980,local_df0);
      Mat::create(in_stack_ffffffffffffed80,(int)((ulong)in_stack_ffffffffffffed78 >> 0x20),
                  (int)in_stack_ffffffffffffed78,(int)(in_stack_ffffffffffffed70 >> 0x20),
                  in_stack_ffffffffffffed68,(int)((ulong)in_stack_ffffffffffffed60 >> 0x20),
                  in_stack_ffffffffffffede0);
      local_950 = local_e00;
      bVar6 = true;
      if (local_e00->data != (void *)0x0) {
        local_678 = local_e00;
        bVar6 = local_e00->cstep * (long)local_e00->c == 0;
      }
      if (bVar6) {
        return -100;
      }
      local_de8 = local_df4 + local_de8;
    }
    for (local_e04 = 0; local_e04 < local_de4; local_e04 = local_e04 + 1) {
      local_630 = &local_e58;
      local_2a4 = local_990->w;
      local_2a8 = local_990->h;
      local_2ac = local_990->d;
      local_e10 = (void *)((long)local_990->data +
                          local_990->cstep * (long)local_e04 * local_990->elemsize);
      local_2c0 = local_990->elemsize;
      local_2c4 = local_990->elempack;
      local_2d0 = local_990->allocator;
      local_2a0 = &local_e58;
      local_8 = (long)local_2a4 * (long)local_2a8 * local_2c0;
      local_920 = &local_e58;
      local_7e8 = &local_e58;
      local_c = 0x10;
      local_638 = local_990;
      local_63c = local_e04;
      local_63d = 1;
      local_e58 = 0;
      local_e48 = 0;
      local_e40 = 0;
      local_e30 = 0;
      local_e2c = 0;
      local_e28 = 0;
      local_e24 = 0;
      local_e20 = 0;
      local_e18 = 0;
      local_e50 = 0;
      local_4e8 = local_7e8;
      local_2b8 = local_e10;
      local_e38 = local_2d0;
      for (local_e60 = 0; uVar7 = local_e60,
          sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_980), uVar7 < sVar2
          ; local_e60 = local_e60 + 1) {
        local_e68 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (local_980,local_e60);
        local_e6c = local_e68->w * local_e68->h;
        local_768 = &local_ec0;
        local_e4 = local_e68->w;
        local_e8 = local_e68->h;
        local_ec = local_e68->d;
        local_e78 = (void *)((long)local_e68->data +
                            local_e68->cstep * (long)local_e04 * local_e68->elemsize);
        local_100 = local_e68->elemsize;
        local_104 = local_e68->elempack;
        local_110 = local_e68->allocator;
        in_stack_ffffffffffffede0 = &local_ec0;
        local_88 = (long)local_e4 * (long)local_e8 * local_100;
        local_910 = &local_ec0;
        local_7d8 = &local_ec0;
        local_8c = 0x10;
        local_774 = local_e04;
        local_775 = 1;
        local_ec0._vptr_Allocator = (_func_int **)0x0;
        local_eb0 = 0;
        local_ea8 = 0;
        local_e98 = 0;
        local_e94 = 0;
        local_e90 = 0;
        local_e8c = 0;
        local_e88 = 0;
        local_e80 = 0;
        local_eb8 = 0;
        local_770 = local_e68;
        local_508 = local_7d8;
        local_f8 = local_e78;
        local_e0 = in_stack_ffffffffffffede0;
        local_ea0 = local_110;
        memcpy(local_e78,local_e10,(long)local_e6c * local_9a0);
        local_e10 = (void *)((long)local_e10 + (long)(local_e6c * local_9a4) * 4);
      }
    }
  }
  if ((local_994 == 3) && (local_9b4 == 2)) {
    local_ec4 = local_990->w;
    local_ec8 = local_990->h;
    local_ecc = local_990->c;
    local_ed0 = 0;
    for (local_ed8 = 0; uVar7 = local_ed8,
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_980), uVar7 < sVar2;
        local_ed8 = local_ed8 + 1) {
      local_edc = *(int *)(local_9b0 + local_ed8 * 4);
      if (local_edc == -0xe9) {
        iVar1 = local_ec4 - local_ed0;
        sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_980);
        local_edc = (int)((ulong)(long)iVar1 / (sVar2 - local_ed8));
      }
      local_ee8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_980,local_ed8);
      Mat::create(in_stack_ffffffffffffed80,(int)((ulong)in_stack_ffffffffffffed78 >> 0x20),
                  (int)in_stack_ffffffffffffed78,(int)(in_stack_ffffffffffffed70 >> 0x20),
                  in_stack_ffffffffffffed68,(int)((ulong)in_stack_ffffffffffffed60 >> 0x20),
                  in_stack_ffffffffffffede0);
      local_958 = local_ee8;
      bVar6 = true;
      if (local_ee8->data != (void *)0x0) {
        local_670 = local_ee8;
        bVar6 = local_ee8->cstep * (long)local_ee8->c == 0;
      }
      if (bVar6) {
        return -100;
      }
      local_ed0 = local_edc + local_ed0;
    }
    for (local_eec = 0; local_eec < local_ecc; local_eec = local_eec + 1) {
      local_650 = &local_f40;
      local_26c = local_990->w;
      local_270 = local_990->h;
      local_274 = local_990->d;
      local_ef8 = (void *)((long)local_990->data +
                          local_990->cstep * (long)local_eec * local_990->elemsize);
      local_288 = local_990->elemsize;
      local_28c = local_990->elempack;
      local_298 = local_990->allocator;
      local_268 = &local_f40;
      local_18 = (long)local_26c * (long)local_270 * local_288;
      local_928 = &local_f40;
      local_7c8 = &local_f40;
      local_1c = 0x10;
      local_658 = local_990;
      local_65c = local_eec;
      local_65d = 1;
      local_f40 = 0;
      local_f30 = 0;
      local_f28 = 0;
      local_f18 = 0;
      local_f14 = 0;
      local_f10 = 0;
      local_f0c = 0;
      local_f08 = 0;
      local_f00 = 0;
      local_f38 = 0;
      local_528 = local_7c8;
      local_280 = local_ef8;
      local_f20 = local_298;
      for (local_f44 = 0; local_f44 < local_ec8; local_f44 = local_f44 + 1) {
        local_f50 = 0;
        while (uVar7 = local_f50,
              sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_980),
              uVar7 < sVar2) {
          local_f58 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                (local_980,local_f50);
          local_788 = &local_fa8;
          local_ac = local_f58->w;
          local_b0 = local_f58->h;
          local_b4 = local_f58->d;
          local_c0 = (void *)((long)local_f58->data +
                             local_f58->cstep * (long)local_eec * local_f58->elemsize);
          local_c8 = local_f58->elemsize;
          local_cc = local_f58->elempack;
          local_d8 = local_f58->allocator;
          local_a8 = &local_fa8;
          local_98 = (long)local_ac * (long)local_b0 * local_c8;
          local_890 = &local_fa8;
          local_f60 = (void *)((long)local_c0 + (long)local_ac * (long)local_f44 * local_c8);
          local_7b8 = &local_fa8;
          local_9c = 0x10;
          local_794 = local_eec;
          local_795 = 1;
          local_894 = local_f44;
          local_fa8 = 0;
          local_f98 = 0;
          local_f90 = 0;
          local_f80 = 0;
          local_f7c = 0;
          local_f78 = 0;
          local_f74 = 0;
          local_f70 = 0;
          local_f68 = 0;
          local_fa0 = 0;
          local_790 = local_f58;
          local_548 = local_7b8;
          local_f88 = local_d8;
          memcpy(local_f60,local_ef8,(long)local_f58->w * local_9a0);
          local_ef8 = (void *)((long)local_ef8 + (long)(local_f58->w * local_9a4) * 4);
          local_f50 = local_f50 + 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Slice_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    const int* slices_ptr = slices;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // slice vector
        int w = bottom_blob.w * elempack;
        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX512F__
                out_elempack = slice % 16 == 0 ? 16 : slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#elif __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = (const float*)bottom_blob + q;
            float* outptr = top_blob;
            memcpy(outptr, ptr, top_blob.w * top_blob.elemsize);

            q += slice;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // slice image height
        int w = bottom_blob.w;
        int h = bottom_blob.h * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX512F__
                out_elempack = slice % 16 == 0 ? 16 : slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#elif __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        const float* ptr = bottom_blob_unpacked;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 8 && top_blob.elempack == 16)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 8;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr0[8] = r1[0];
                        outptr0[9] = r1[1];
                        outptr0[10] = r1[2];
                        outptr0[11] = r1[3];
                        outptr0[12] = r1[4];
                        outptr0[13] = r1[5];
                        outptr0[14] = r1[6];
                        outptr0[15] = r1[7];

                        r0 += 8;
                        r1 += 8;
                        outptr0 += 16;
                    }

                    ptr += w * 16;
                }
            }
            if (out_elempack == 4 && top_blob.elempack == 16)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 4;
                    const float* r2 = ptr + w * 8;
                    const float* r3 = ptr + w * 12;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];
                        outptr0[8] = r2[0];
                        outptr0[9] = r2[1];
                        outptr0[10] = r2[2];
                        outptr0[11] = r2[3];
                        outptr0[12] = r3[0];
                        outptr0[13] = r3[1];
                        outptr0[14] = r3[2];
                        outptr0[15] = r3[3];

                        r0 += 4;
                        r1 += 4;
                        r2 += 4;
                        r3 += 4;
                        outptr0 += 16;
                    }

                    ptr += w * 16;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 16)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;
                    const float* r4 = ptr + w * 4;
                    const float* r5 = ptr + w * 5;
                    const float* r6 = ptr + w * 6;
                    const float* r7 = ptr + w * 7;
                    const float* r8 = ptr + w * 8;
                    const float* r9 = ptr + w * 9;
                    const float* ra = ptr + w * 10;
                    const float* rb = ptr + w * 11;
                    const float* rc = ptr + w * 12;
                    const float* rd = ptr + w * 13;
                    const float* re = ptr + w * 14;
                    const float* rf = ptr + w * 15;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;
                        outptr0[8] = *r8++;
                        outptr0[9] = *r9++;
                        outptr0[10] = *ra++;
                        outptr0[11] = *rb++;
                        outptr0[12] = *rc++;
                        outptr0[13] = *rd++;
                        outptr0[14] = *re++;
                        outptr0[15] = *rf++;

                        outptr0 += 16;
                    }

                    ptr += w * 16;
                }
            }
#endif // __AVX512F__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w * 4;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;
                    const float* r4 = ptr + w * 4;
                    const float* r5 = ptr + w * 5;
                    const float* r6 = ptr + w * 6;
                    const float* r7 = ptr + w * 7;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    ptr += w * 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                for (int j = 0; j < top_blob.h; j++)
                {
                    const float* r0 = ptr;
                    const float* r1 = ptr + w;
                    const float* r2 = ptr + w * 2;
                    const float* r3 = ptr + w * 3;

                    float* outptr0 = top_blob.row(j);

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    ptr += w * 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = w * top_blob.h;

                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                ptr += size * top_blob.elempack;
            }
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // slice image width
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const float* ptr = bottom_blob.row<const float>(j);
            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                float* outptr = top_blob.row(j);
                memcpy(outptr, ptr, top_blob.w * elemsize);

                ptr += top_blob.w * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 0)
    {
        // slice dim channel
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c * elempack;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (channels - q) / (top_blobs.size() - i);
            }

            int out_elempack = 1;
#if __SSE2__
            if (opt.use_packing_layout)
            {
#if __AVX512F__
                out_elempack = slice % 16 == 0 ? 16 : slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#elif __AVX__
                out_elempack = slice % 8 == 0 ? 8 : slice % 4 == 0 ? 4 : 1;
#else
                out_elempack = slice % 4 == 0 ? 4 : 1;
#endif
            }
#endif // __SSE2__
            size_t out_elemsize = elemsize / elempack * out_elempack;

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        size_t out_elemsize = top_blobs[0].elemsize;
        int out_elempack = top_blobs[0].elempack;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            out_elemsize = std::min(out_elemsize, top_blobs[i].elemsize);
            out_elempack = std::min(out_elempack, top_blobs[i].elempack);
        }

        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > out_elempack)
        {
            convert_packing(bottom_blob, bottom_blob_unpacked, out_elempack, opt);
        }

        int p = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            Mat& top_blob = top_blobs[i];

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 8 && top_blob.elempack == 16)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr0[8] = r1[0];
                        outptr0[9] = r1[1];
                        outptr0[10] = r1[2];
                        outptr0[11] = r1[3];
                        outptr0[12] = r1[4];
                        outptr0[13] = r1[5];
                        outptr0[14] = r1[6];
                        outptr0[15] = r1[7];

                        r0 += 8;
                        r1 += 8;
                        outptr0 += 16;
                    }

                    p += 2;
                }
            }
            if (out_elempack == 4 && top_blob.elempack == 16)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];
                        outptr0[8] = r2[0];
                        outptr0[9] = r2[1];
                        outptr0[10] = r2[2];
                        outptr0[11] = r2[3];
                        outptr0[12] = r3[0];
                        outptr0[13] = r3[1];
                        outptr0[14] = r3[2];
                        outptr0[15] = r3[3];

                        r0 += 4;
                        r1 += 4;
                        r2 += 4;
                        r3 += 4;
                        outptr0 += 16;
                    }

                    p += 4;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 16)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);
                    const float* r4 = bottom_blob_unpacked.channel(p + 4);
                    const float* r5 = bottom_blob_unpacked.channel(p + 5);
                    const float* r6 = bottom_blob_unpacked.channel(p + 6);
                    const float* r7 = bottom_blob_unpacked.channel(p + 7);
                    const float* r8 = bottom_blob_unpacked.channel(p + 8);
                    const float* r9 = bottom_blob_unpacked.channel(p + 9);
                    const float* ra = bottom_blob_unpacked.channel(p + 10);
                    const float* rb = bottom_blob_unpacked.channel(p + 11);
                    const float* rc = bottom_blob_unpacked.channel(p + 12);
                    const float* rd = bottom_blob_unpacked.channel(p + 13);
                    const float* re = bottom_blob_unpacked.channel(p + 14);
                    const float* rf = bottom_blob_unpacked.channel(p + 15);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;
                        outptr0[8] = *r8++;
                        outptr0[9] = *r9++;
                        outptr0[10] = *ra++;
                        outptr0[11] = *rb++;
                        outptr0[12] = *rc++;
                        outptr0[13] = *rd++;
                        outptr0[14] = *re++;
                        outptr0[15] = *rf++;

                        outptr0 += 16;
                    }

                    p += 16;
                }
            }
#endif // __AVX512F__
            if (out_elempack == 4 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r1[0];
                        outptr0[5] = r1[1];
                        outptr0[6] = r1[2];
                        outptr0[7] = r1[3];

                        r0 += 4;
                        r1 += 4;
                        outptr0 += 8;
                    }

                    p += 2;
                }
            }
            if (out_elempack == 1 && top_blob.elempack == 8)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);
                    const float* r4 = bottom_blob_unpacked.channel(p + 4);
                    const float* r5 = bottom_blob_unpacked.channel(p + 5);
                    const float* r6 = bottom_blob_unpacked.channel(p + 6);
                    const float* r7 = bottom_blob_unpacked.channel(p + 7);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;
                        outptr0[4] = *r4++;
                        outptr0[5] = *r5++;
                        outptr0[6] = *r6++;
                        outptr0[7] = *r7++;

                        outptr0 += 8;
                    }

                    p += 8;
                }
            }
#endif // __AVX__
            if (out_elempack == 1 && top_blob.elempack == 4)
            {
                int size = top_blob.w * top_blob.h;

                for (int q = 0; q < top_blob.c; q++)
                {
                    const float* r0 = bottom_blob_unpacked.channel(p);
                    const float* r1 = bottom_blob_unpacked.channel(p + 1);
                    const float* r2 = bottom_blob_unpacked.channel(p + 2);
                    const float* r3 = bottom_blob_unpacked.channel(p + 3);

                    float* outptr0 = top_blob.channel(q);

                    for (int j = 0; j < size; j++)
                    {
                        outptr0[0] = *r0++;
                        outptr0[1] = *r1++;
                        outptr0[2] = *r2++;
                        outptr0[3] = *r3++;

                        outptr0 += 4;
                    }

                    p += 4;
                }
            }
#endif // __SSE2__
            if (out_elempack == top_blob.elempack)
            {
                // 1-1 4-4 8-8
                int size = top_blob.total();

                const float* ptr = bottom_blob_unpacked.channel(p);
                float* outptr = top_blob;
                memcpy(outptr, ptr, size * top_blob.elemsize);

                p += top_blob.c;
            }
        }
    }

    if (dims == 3 && positive_axis == 1)
    {
        // slice dim height
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (size_t i = 0; i < top_blobs.size(); i++)
            {
                Mat& top_blob = top_blobs[i];

                int size = top_blob.w * top_blob.h;

                float* outptr = top_blob.channel(p);
                memcpy(outptr, ptr, size * elemsize);

                ptr += size * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        // slice dim width
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            q += slice;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < channels; p++)
        {
            const float* ptr = bottom_blob.channel(p);

            for (int j = 0; j < h; j++)
            {
                for (size_t i = 0; i < top_blobs.size(); i++)
                {
                    Mat& top_blob = top_blobs[i];

                    float* outptr = top_blob.channel(p).row(j);
                    memcpy(outptr, ptr, top_blob.w * elemsize);

                    ptr += top_blob.w * elempack;
                }
            }
        }
    }

    return 0;
}